

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O3

DisasJumpType op_vfsq(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  uint uVar2;
  TCGContext_conflict12 *tcg_ctx;
  code *fn;
  
  uVar1 = (s->fields).presentO;
  if (((uVar1 & 0x10) != 0) && ((uVar1 & 0x20) != 0)) {
    if (((char)(s->fields).c[2] != '\x03') || (uVar2 = (s->fields).c[3], (uVar2 & 7) != 0)) {
      gen_program_exception(s,6);
      return DISAS_NORETURN;
    }
    fn = gen_helper_gvec_vfsq64s;
    if ((uVar2 & 8) == 0) {
      fn = gen_helper_gvec_vfsq64;
    }
    if ((uVar1 >> 0x16 & 1) != 0) {
      uVar2 = (s->fields).c[0];
      if ((uVar2 & 0xe0) == 0) {
        if ((uVar1 >> 0x17 & 1) == 0) goto LAB_00cd0c5d;
        uVar1 = (s->fields).c[6];
        if ((uVar1 & 0xe0) == 0) {
          tcg_ctx = s->uc->tcg_ctx;
          tcg_gen_gvec_2_ptr_s390x
                    (tcg_ctx,(uVar2 & 0x1f) * 0x10 + 0x80,(uVar1 & 0x1f) * 0x10 + 0x80,
                     tcg_ctx->cpu_env,0x10,0x10,0,fn);
          return DISAS_NEXT;
        }
      }
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                 ,0xdf,"reg < 32");
    }
  }
LAB_00cd0c5d:
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_vfsq(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t fpf = get_field(s, m3);
    const uint8_t m4 = get_field(s, m4);
    gen_helper_gvec_2_ptr *fn = gen_helper_gvec_vfsq64;

    if (fpf != FPF_LONG || extract32(m4, 0, 3)) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    if (extract32(m4, 3, 1)) {
        fn = gen_helper_gvec_vfsq64s;
    }
    gen_gvec_2_ptr(tcg_ctx, get_field(s, v1), get_field(s, v2), tcg_ctx->cpu_env,
                   0, fn);
    return DISAS_NEXT;
}